

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O0

int __thiscall CDELECommand::doWhat(CDELECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c9;
  undefined1 local_c8 [8];
  string ret_2;
  undefined1 local_a0 [8];
  string ret;
  allocator local_69;
  undefined1 local_68 [8];
  string ret_1;
  FILE *file;
  CClient *local_20;
  CClient *pClient_local;
  CDELECommand *this_local;
  
  local_20 = pClient;
  pClient_local = (CClient *)this;
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c8,"530 Please login with USER and PASS.\r\n",&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    CClient::sendMsg(local_20,(string *)local_c8);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_c8);
  }
  else {
    CClient::GetUserDir_abi_cxx11_((string *)&file,local_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    chdir(pcVar3);
    std::__cxx11::string::~string((string *)&file);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ret_1.field_2._8_8_ = fopen(pcVar3,"rb");
    if ((FILE *)ret_1.field_2._8_8_ != (FILE *)0x0) {
      fclose((FILE *)ret_1.field_2._8_8_);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar2 = remove(pcVar3);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_68,"250 Delete operation successful.\r\n",&local_69);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        CClient::sendMsg(local_20,(string *)local_68);
        this_local._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_68);
        return this_local._4_4_;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,"550 Delete operation failed.\r\n",
               (allocator *)(ret_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(ret_2.field_2._M_local_buf + 0xf));
    CClient::sendMsg(local_20,(string *)local_a0);
    this_local._4_4_ = -1;
    std::__cxx11::string::~string((string *)local_a0);
  }
  return this_local._4_4_;
}

Assistant:

int CDELECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        FILE *file = fopen(m_Args.c_str(),"rb");
        if(file != NULL){
            fclose(file);
            if(0 == remove(m_Args.c_str())){
                string ret = "250 Delete operation successful.\r\n";
                pClient->sendMsg(ret);
                return 1;
            }
        }
        string ret = "550 Delete operation failed.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}